

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Util.cpp
# Opt level: O0

bool IsFile(string *path)

{
  int iVar1;
  char *__file;
  bool local_a1;
  undefined1 local_a0 [8];
  stat st;
  string *path_local;
  
  st.__glibc_reserved[2] = (__syscall_slong_t)path;
  memset(local_a0,0,0x90);
  __file = (char *)std::__cxx11::string::c_str();
  iVar1 = stat64(__file,(stat64 *)local_a0);
  local_a1 = iVar1 == 0 && ((uint)st.st_nlink & 0xf000) == 0x8000;
  return local_a1;
}

Assistant:

bool IsFile(const std::string& path)
{
#ifdef _WIN32
    WIN32_FILE_ATTRIBUTE_DATA wfad;
    return GetFileAttributesEx(path.c_str(), GetFileExInfoStandard, &wfad) &&
        !(wfad.dwFileAttributes & FILE_ATTRIBUTE_DIRECTORY);
#else
    struct stat st = {};
    return stat(path.c_str(), &st) == 0 && S_ISREG(st.st_mode);
#endif
}